

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O1

Specification * ExprEval::Operator::get_specification(string *symbol)

{
  Specification *pSVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  Specification *pSVar4;
  long lVar5;
  long lVar6;
  
  pSVar1 = (Specification *)*specification_table;
  if (specification_table[1] - (long)pSVar1 != 0) {
    lVar6 = specification_table[1] - (long)pSVar1 >> 7;
    __s2 = (symbol->_M_dataplus)._M_p;
    sVar2 = symbol->_M_string_length;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    lVar5 = 0;
    pSVar4 = pSVar1;
    do {
      __n = (pSVar4->symbol)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          return pSVar4;
        }
        iVar3 = bcmp((pSVar4->symbol)._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) {
          return pSVar1 + lVar5;
        }
      }
      lVar5 = lVar5 + 1;
      pSVar4 = pSVar4 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return (Specification *)0x0;
}

Assistant:

Operator::Specification* get_specification(const std::string& symbol){
            auto table = specification_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return &(table->at(i));
            }
            return nullptr;
        }